

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlutils.cpp
# Opt level: O1

vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_> *
libcellml::multiRootXml
          (vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
           *__return_storage_ptr__,string *content)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  XmlDoc *pXVar3;
  bool bVar4;
  int iVar5;
  XmlDoc *pXVar6;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  size_type *psVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  XmlDoc *pXVar11;
  long lVar12;
  XmlDoc *pXVar13;
  string childContent;
  XmlNodePtr child;
  XmlDocPtr doc;
  XmlDocPtr childDoc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> wrappedContent;
  XmlNodePtr rootNode;
  undefined1 local_e9;
  XmlDoc *local_e8;
  ulong local_e0;
  XmlDoc local_d8;
  undefined8 uStack_d0;
  string local_c8;
  XmlNode local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  XmlDoc *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  XmlDoc local_88;
  undefined8 uStack_80;
  value_type local_78;
  string local_68;
  string *local_48;
  XmlDoc local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8 = &local_d8;
  pcVar2 = (content->_M_dataplus)._M_p;
  local_48 = content;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,pcVar2,pcVar2 + content->_M_string_length);
  pXVar3 = local_e8;
  pXVar6 = (XmlDoc *)((long)&local_e8->mPimpl + local_e0);
  pXVar11 = local_e8;
  if (0 < (long)local_e0 >> 2) {
    pXVar11 = (XmlDoc *)((long)&local_e8->mPimpl + (local_e0 & 0xfffffffffffffffc));
    lVar12 = ((long)local_e0 >> 2) + 1;
    pXVar13 = (XmlDoc *)((long)&local_e8->mPimpl + 3);
    do {
      iVar5 = isspace((int)*(char *)((long)&pXVar13[-1].mPimpl + 5));
      if (iVar5 == 0) {
        pXVar13 = (XmlDoc *)((long)&pXVar13[-1].mPimpl + 5);
        goto LAB_0029a752;
      }
      iVar5 = isspace((int)*(char *)((long)&pXVar13[-1].mPimpl + 6));
      if (iVar5 == 0) {
        pXVar13 = (XmlDoc *)((long)&pXVar13[-1].mPimpl + 6);
        goto LAB_0029a752;
      }
      iVar5 = isspace((int)*(char *)((long)&pXVar13[-1].mPimpl + 7));
      if (iVar5 == 0) {
        pXVar13 = (XmlDoc *)((long)&pXVar13[-1].mPimpl + 7);
        goto LAB_0029a752;
      }
      iVar5 = isspace((int)*(char *)&pXVar13->mPimpl);
      if (iVar5 == 0) goto LAB_0029a752;
      lVar12 = lVar12 + -1;
      pXVar13 = (XmlDoc *)((long)&pXVar13->mPimpl + 4);
    } while (1 < lVar12);
  }
  lVar12 = (long)pXVar6 - (long)pXVar11;
  if (lVar12 == 1) {
LAB_0029a72e:
    iVar5 = isspace((int)*(char *)&pXVar11->mPimpl);
    pXVar13 = pXVar11;
    if (iVar5 != 0) {
      pXVar13 = pXVar6;
    }
  }
  else if (lVar12 == 2) {
LAB_0029a71d:
    iVar5 = isspace((int)*(char *)&pXVar11->mPimpl);
    pXVar13 = pXVar11;
    if (iVar5 != 0) {
      pXVar11 = (XmlDoc *)((long)&pXVar11->mPimpl + 1);
      goto LAB_0029a72e;
    }
  }
  else {
    pXVar13 = pXVar6;
    if ((lVar12 == 3) &&
       (iVar5 = isspace((int)*(char *)&pXVar11->mPimpl), pXVar13 = pXVar11, iVar5 != 0)) {
      pXVar11 = (XmlDoc *)((long)&pXVar11->mPimpl + 1);
      goto LAB_0029a71d;
    }
  }
LAB_0029a752:
  if (pXVar6 == pXVar13) {
    local_e0 = 0;
    *(undefined1 *)&pXVar3->mPimpl = 0;
  }
  else {
    std::__cxx11::string::_M_erase((ulong)&local_e8,0);
  }
  pXVar3 = local_e8;
  pXVar6 = (XmlDoc *)((long)&local_e8->mPimpl + local_e0);
  lVar12 = (long)local_e0 >> 2;
  pXVar11 = pXVar6;
  if (0 < lVar12) {
    pXVar11 = (XmlDoc *)((long)pXVar6 + lVar12 * -4);
    lVar12 = lVar12 + 1;
    do {
      iVar5 = isspace((int)*(char *)((long)&pXVar6[-1].mPimpl + 7));
      if (iVar5 == 0) goto LAB_0029a85f;
      iVar5 = isspace((int)*(char *)((long)&pXVar6[-1].mPimpl + 6));
      if (iVar5 == 0) {
        pXVar6 = (XmlDoc *)((long)&pXVar6[-1].mPimpl + 7);
        goto LAB_0029a85f;
      }
      iVar5 = isspace((int)*(char *)((long)&pXVar6[-1].mPimpl + 5));
      if (iVar5 == 0) {
        pXVar6 = (XmlDoc *)((long)&pXVar6[-1].mPimpl + 6);
        goto LAB_0029a85f;
      }
      iVar5 = isspace((int)*(char *)((long)&pXVar6[-1].mPimpl + 4));
      if (iVar5 == 0) {
        pXVar6 = (XmlDoc *)((long)&pXVar6[-1].mPimpl + 5);
        goto LAB_0029a85f;
      }
      pXVar6 = (XmlDoc *)((long)&pXVar6[-1].mPimpl + 4);
      lVar12 = lVar12 + -1;
    } while (1 < lVar12);
  }
  lVar12 = (long)pXVar11 - (long)pXVar3;
  if (lVar12 != 1) {
    if (lVar12 != 2) {
      pXVar6 = pXVar3;
      if ((lVar12 != 3) ||
         (iVar5 = isspace((int)*(char *)((long)&pXVar11[-1].mPimpl + 7)), pXVar6 = pXVar11,
         iVar5 == 0)) goto LAB_0029a85f;
      pXVar11 = (XmlDoc *)((long)&pXVar11[-1].mPimpl + 7);
    }
    iVar5 = isspace((int)*(char *)((long)&pXVar11[-1].mPimpl + 7));
    pXVar6 = pXVar11;
    if (iVar5 == 0) goto LAB_0029a85f;
    pXVar11 = (XmlDoc *)((long)&pXVar11[-1].mPimpl + 7);
  }
  iVar5 = isspace((int)*(char *)((long)&pXVar11[-1].mPimpl + 7));
  pXVar6 = pXVar11;
  if (iVar5 != 0) {
    pXVar6 = pXVar3;
  }
LAB_0029a85f:
  *(undefined1 *)&pXVar6->mPimpl = 0;
  if (local_e8 == &local_d8) {
    uStack_80 = uStack_d0;
    local_98 = &local_88;
  }
  else {
    local_98 = local_e8;
  }
  local_88.mPimpl._1_7_ = local_d8.mPimpl._1_7_;
  local_88.mPimpl._0_1_ = local_d8.mPimpl._0_1_;
  local_e0 = 0;
  local_d8.mPimpl._0_1_ = 0;
  local_e8 = &local_d8;
  local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)pXVar6 - (long)pXVar3);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x2b77eb);
  paVar1 = &local_c8.field_2;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar8) {
    local_c8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_c8.field_2._8_8_ = plVar7[3];
    local_c8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_c8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_c8._M_string_length = plVar7[1];
  *plVar7 = (long)paVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_68.field_2._M_allocated_capacity = *psVar9;
    local_68.field_2._8_8_ = plVar7[3];
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar9;
    local_68._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_68._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,(ulong)((long)&(local_88.mPimpl)->mXmlDocPtr + 1));
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,CONCAT71(local_d8.mPimpl._1_7_,local_d8.mPimpl._0_1_) + 1);
  }
  local_98 = (XmlDoc *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<libcellml::XmlDoc,std::allocator<libcellml::XmlDoc>>
            (&local_90,&local_98,(allocator<libcellml::XmlDoc> *)&local_c8);
  XmlDoc::parse(local_98,&local_68);
  XmlDoc::rootNode(&local_40);
  if (local_40.mPimpl == (XmlDocImpl *)0x0) {
    local_c8._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<libcellml::XmlDoc,std::allocator<libcellml::XmlDoc>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8._M_string_length,
               (XmlDoc **)&local_c8,(allocator<libcellml::XmlDoc> *)&local_a8);
    XmlDoc::parse((XmlDoc *)local_c8._M_dataplus._M_p,local_48);
    std::
    vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_c8);
    p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length;
  }
  else {
    XmlNode::firstChild(&local_a8);
    p_Var10 = p_Stack_a0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.mPimpl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      do {
        bVar4 = XmlNode::isElement((XmlNode *)local_a8.mPimpl);
        if (bVar4) {
          XmlNode::convertToString_abi_cxx11_(&local_c8,(XmlNode *)local_a8.mPimpl);
          local_78.super___shared_ptr<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (XmlDoc *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<libcellml::XmlDoc,std::allocator<libcellml::XmlDoc>>
                    (&local_78.super___shared_ptr<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(XmlDoc **)&local_78,(allocator<libcellml::XmlDoc> *)&local_e9);
          XmlDoc::parse(local_78.super___shared_ptr<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,&local_c8);
          std::
          vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
          ::push_back(__return_storage_ptr__,&local_78);
          if (local_78.super___shared_ptr<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.super___shared_ptr<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != paVar1) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
        }
        XmlNode::next((XmlNode *)&local_c8);
        p_Var10 = p_Stack_a0;
        p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length;
        local_a8.mPimpl = (XmlNodeImpl *)local_c8._M_dataplus._M_p;
        local_c8._M_dataplus._M_p = (pointer)0x0;
        local_c8._M_string_length = 0;
        if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length);
        }
        p_Var10 = p_Stack_a0;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_a8.mPimpl !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0);
    }
  }
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<XmlDocPtr> multiRootXml(const std::string &content)
{
    std::vector<XmlDocPtr> childDocs;

    // Wrap potentially multiple nodes in our own root node.
    auto wrappedContent = "<root>" + trimCopy(content) + "</root>";

    // Parse this new string as a document and turn the child nodes
    // into their own document.
    XmlDocPtr doc = std::make_shared<XmlDoc>();
    doc->parse(wrappedContent);
    XmlNodePtr rootNode = doc->rootNode();
    if (rootNode != nullptr) {
        XmlNodePtr child = rootNode->firstChild();
        while (child != nullptr) {
            if (child->isElement()) {
                auto childContent = child->convertToString();
                XmlDocPtr childDoc = std::make_shared<XmlDoc>();
                childDoc->parse(childContent);
                childDocs.push_back(childDoc);
            }
            child = child->next();
        }
    } else {
        XmlDocPtr originalContentDoc = std::make_shared<XmlDoc>();
        originalContentDoc->parse(content);
        childDocs.push_back(originalContentDoc);
    }

    return childDocs;
}